

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::AssignFrameSlotsRegister(ByteCodeGenerator *this)

{
  Type pFVar1;
  RegSlot RVar2;
  Type *ppFVar3;
  FuncInfo *top;
  ByteCodeGenerator *this_local;
  
  ppFVar3 = SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Top(this->funcInfoStack);
  pFVar1 = *ppFVar3;
  if (pFVar1->frameSlotsRegister == 0xffffffff) {
    RVar2 = NextVarRegister(this);
    pFVar1->frameSlotsRegister = RVar2;
  }
  return;
}

Assistant:

void ByteCodeGenerator::AssignFrameSlotsRegister()
{
    FuncInfo* top = funcInfoStack->Top();
    if (top->frameSlotsRegister == Js::Constants::NoRegister)
    {
        top->frameSlotsRegister = NextVarRegister();
    }
}